

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O0

void anon_unknown.dwarf_208998::reverse_and_mulX_ghash(uint8_t *b)

{
  uint64_t uVar1;
  uint64_t uVar2;
  crypto_word_t cVar3;
  uint64_t v;
  crypto_word_t carry;
  uint64_t lo;
  uint64_t hi;
  uint8_t *b_local;
  
  uVar1 = CRYPTO_load_u64_le(b);
  uVar2 = CRYPTO_load_u64_le(b + 8);
  cVar3 = constant_time_eq_w(uVar1 & 1,1);
  cVar3 = constant_time_select_w(cVar3,0xe1,0);
  v = CRYPTO_bswap8(cVar3 << 0x38 ^ uVar2 >> 1);
  CRYPTO_store_u64_le(b,v);
  uVar1 = CRYPTO_bswap8(uVar2 << 0x3f | uVar1 >> 1);
  CRYPTO_store_u64_le(b + 8,uVar1);
  return;
}

Assistant:

void reverse_and_mulX_ghash(uint8_t b[16]) {
  uint64_t hi = CRYPTO_load_u64_le(b);
  uint64_t lo = CRYPTO_load_u64_le(b + 8);
  const crypto_word_t carry = constant_time_eq_w(hi & 1, 1);
  hi >>= 1;
  hi |= lo << 63;
  lo >>= 1;
  lo ^= ((uint64_t)constant_time_select_w(carry, 0xe1, 0)) << 56;

  CRYPTO_store_u64_le(b, CRYPTO_bswap8(lo));
  CRYPTO_store_u64_le(b + 8, CRYPTO_bswap8(hi));
}